

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

int mbedtls_sha1_finish(mbedtls_sha1_context *ctx,uchar *output)

{
  uint uVar1;
  uint uVar2;
  uint *in_RSI;
  uint *in_RDI;
  uint32_t low;
  uint32_t high;
  uint32_t used;
  int ret;
  int local_84;
  uchar *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  uVar2 = (*in_RDI & 0x3f) + 1;
  *(undefined1 *)((long)in_RDI + (ulong)(*in_RDI & 0x3f) + 0x1c) = 0x80;
  if (uVar2 < 0x39) {
    memset((void *)((long)in_RDI + (ulong)uVar2 + 0x1c),0,(ulong)(0x38 - uVar2));
  }
  else {
    memset((void *)((long)in_RDI + (ulong)uVar2 + 0x1c),0,(ulong)(0x40 - uVar2));
    local_84 = mbedtls_internal_sha1_process
                         ((mbedtls_sha1_context *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          in_stack_ffffffffffffffb8);
    if (local_84 != 0) goto LAB_00864738;
    memset(in_RDI + 7,0,0x38);
  }
  uVar1 = in_RDI[1] << 3;
  uVar2 = *in_RDI << 3;
  in_RDI[0x15] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                 (*in_RDI >> 0x1d | uVar1) << 0x18;
  in_RDI[0x16] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | *in_RDI << 0x1b;
  local_84 = mbedtls_internal_sha1_process
                       ((mbedtls_sha1_context *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8);
  if (local_84 == 0) {
    uVar2 = in_RDI[2];
    *in_RSI = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = in_RDI[3];
    in_RSI[1] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = in_RDI[4];
    in_RSI[2] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = in_RDI[5];
    in_RSI[3] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    uVar2 = in_RDI[6];
    in_RSI[4] = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    local_84 = 0;
  }
LAB_00864738:
  mbedtls_sha1_free((mbedtls_sha1_context *)0x864742);
  return local_84;
}

Assistant:

int mbedtls_sha1_finish(mbedtls_sha1_context *ctx,
                        unsigned char output[20])
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    uint32_t used;
    uint32_t high, low;

    /*
     * Add padding: 0x80 then 0x00 until 8 bytes remain for the length
     */
    used = ctx->total[0] & 0x3F;

    ctx->buffer[used++] = 0x80;

    if (used <= 56) {
        /* Enough room for padding + length in current block */
        memset(ctx->buffer + used, 0, 56 - used);
    } else {
        /* We'll need an extra block */
        memset(ctx->buffer + used, 0, 64 - used);

        if ((ret = mbedtls_internal_sha1_process(ctx, ctx->buffer)) != 0) {
            goto exit;
        }

        memset(ctx->buffer, 0, 56);
    }

    /*
     * Add message length
     */
    high = (ctx->total[0] >> 29)
           | (ctx->total[1] <<  3);
    low  = (ctx->total[0] <<  3);

    MBEDTLS_PUT_UINT32_BE(high, ctx->buffer, 56);
    MBEDTLS_PUT_UINT32_BE(low,  ctx->buffer, 60);

    if ((ret = mbedtls_internal_sha1_process(ctx, ctx->buffer)) != 0) {
        goto exit;
    }

    /*
     * Output final state
     */
    MBEDTLS_PUT_UINT32_BE(ctx->state[0], output,  0);
    MBEDTLS_PUT_UINT32_BE(ctx->state[1], output,  4);
    MBEDTLS_PUT_UINT32_BE(ctx->state[2], output,  8);
    MBEDTLS_PUT_UINT32_BE(ctx->state[3], output, 12);
    MBEDTLS_PUT_UINT32_BE(ctx->state[4], output, 16);

    ret = 0;

exit:
    mbedtls_sha1_free(ctx);
    return ret;
}